

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoProcessing.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  uchar *puVar3;
  size_t sVar4;
  uchar **in_R8;
  ulong uVar5;
  int rank;
  char finalWinName [14];
  VideoCapture cap;
  Mat frame;
  int local_16c;
  _InputArray local_168;
  _InputArray local_150;
  undefined8 *local_138;
  undefined1 *local_130;
  undefined8 local_128 [4];
  undefined8 local_104;
  undefined1 local_fc [4];
  undefined1 local_f8 [8];
  _InputArray local_f0 [4];
  Mat local_90 [96];
  
  MPI_Init(local_fc,local_f8);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_16c);
  MPI_Comm_size(&ompi_mpi_comm_world);
  WIDTH = 0x280;
  HEIGHT = 0x1e0;
  lVar1 = (long)numberProcesses;
  iVar2 = (int)(0x1e0 / lVar1);
  stripSize = iVar2;
  stripImage = (uchar *)malloc((long)(iVar2 * 0x280));
  stripMatrix = (uchar **)malloc((long)iVar2 * 8);
  if (0 < iVar2) {
    uVar5 = 0;
    do {
      puVar3 = (uchar *)malloc(0x280);
      stripMatrix[uVar5] = puVar3;
      uVar5 = uVar5 + 1;
    } while ((0x1e0 / lVar1 & 0xffffffffU) != uVar5);
  }
  fullImage = (uchar *)malloc(0x4b000);
  do {
    iVar2 = (int)in_R8;
    if (local_16c == 0) {
      cv::VideoCapture::VideoCapture((VideoCapture *)&local_138,0,0);
      cv::Mat::Mat((Mat *)local_f0);
      cv::VideoCapture::operator>>((VideoCapture *)&local_138,(Mat *)local_f0);
      local_150.sz.width = 0;
      local_150.sz.height = 0;
      local_150.flags = 0x1010000;
      local_168.sz.width = 0;
      local_168.sz.height = 0;
      local_168.flags = 0x2010000;
      local_168.obj._0_6_ = SUB86(local_f0,0);
      local_168.obj._6_2_ = (undefined2)((ulong)local_f0 >> 0x30);
      local_150.obj = local_f0;
      cv::cvtColor((cv *)&local_150,&local_168,(_OutputArray *)0x6,0,iVar2);
      cv::Mat::Mat(local_90,(Mat *)local_f0);
      readImage(local_90);
      cv::Mat::~Mat(local_90);
      cv::Mat::~Mat((Mat *)local_f0);
      cv::VideoCapture::~VideoCapture((VideoCapture *)&local_138);
    }
    MPI_Bcast(&WIDTH,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
    MPI_Bcast(&HEIGHT,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
    MPI_Bcast(&MAX_COLOR,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
    horizontalStrips(local_16c);
    sendStripstoAllProcesses(local_16c);
    in_R8 = stripMatrix;
    cv::Mat::Mat((Mat *)local_f0,stripSize,WIDTH,0,stripMatrix,0);
    cv::Mat::operator=((Mat *)stripImageMat,(Mat *)local_f0);
    cv::Mat::~Mat((Mat *)local_f0);
    stripImageMat._16_8_ = tempBuffer;
    MPI_Barrier(&ompi_mpi_comm_world);
    local_f0[0].sz.width = 0;
    local_f0[0].sz.height = 0;
    local_f0[0].flags = 0x1010000;
    local_f0[0].obj = stripImageMat;
    local_128[0] = 0;
    local_138._0_4_ = 0x2010000;
    local_130 = stripImageMat;
    local_104 = 0x700000007;
    cv::GaussianBlur(0x3ff8000000000000,0x3ff8000000000000,local_f0,(VideoCapture *)&local_138,
                     &local_104);
    local_f0[0].sz.width = 0;
    local_f0[0].sz.height = 0;
    local_f0[0].flags = 0x1010000;
    local_f0[0].obj = stripImageMat;
    local_128[0] = 0;
    local_138 = (undefined8 *)CONCAT44(local_138._4_4_,0x2010000);
    local_130 = stripImageMat;
    cv::Canny(local_f0,(_OutputArray *)&local_138,0.0,30.0,3,false);
    stichImages();
    if (local_16c == 0) {
      in_R8 = (uchar **)fullImage;
      cv::Mat::Mat((Mat *)local_f0,HEIGHT,WIDTH,0,fullImage,0);
      local_168.obj._0_6_ = 0x20776f646e;
      local_168.flags = 0x616e6946;
      local_168._4_2_ = 0x206c;
      local_168._6_2_ = 26999;
      local_138 = local_128;
      sVar4 = strlen((char *)&local_168);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,&local_168,(long)&local_168.flags + sVar4);
      local_150.sz.width = 0;
      local_150.sz.height = 0;
      local_150.flags = 0x1010000;
      local_150.obj = local_f0;
      cv::imshow((string *)&local_138,&local_150);
      if (local_138 != local_128) {
        operator_delete(local_138);
      }
      cv::Mat::~Mat((Mat *)local_f0);
    }
    iVar2 = cv::waitKey(1);
  } while (iVar2 != 0x1b);
  cleanUp();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    int i, j, bufferInt[20], rank;
    char imageFile[20];

    MPI_Status status;
    MPI_Request *requests;
    MPI_Status *statuses;
    MPI_Init(&argc, &argv);
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    MPI_Comm_size(MPI_COMM_WORLD, &numberProcesses);
    WIDTH=640;
    HEIGHT=480;
    stripSize=HEIGHT/numberProcesses;
    stripImage = (unsigned char *) malloc(WIDTH * stripSize * sizeof(unsigned char));
    stripMatrix = (unsigned char **) malloc(stripSize * sizeof(unsigned char *));
    for (i = 0; i < stripSize; i++) {
        stripMatrix[i] = (unsigned char *) malloc(WIDTH * sizeof(unsigned char));
    }
    fullImage = (unsigned char *) malloc(WIDTH * HEIGHT * sizeof(unsigned char));
    while (1) {
        if (rank == 0) {
            VideoCapture cap(0);
            Mat frame;
            cap >> frame; // get a new frame from camera
            cvtColor(frame, frame, COLOR_BGR2GRAY);
            //readImage("../res/images.jpg");
            readImage(frame);
            //Start Communication
            //cout<<"Communication started";
        }

        MPI_Bcast(&WIDTH, 1, MPI_INT, 0, MPI_COMM_WORLD);
        MPI_Bcast(&HEIGHT, 1, MPI_INT, 0, MPI_COMM_WORLD);
        MPI_Bcast(&MAX_COLOR, 1, MPI_INT, 0, MPI_COMM_WORLD);

        horizontalStrips(rank);
        //printf("\n[Process %d] Image Width: %d X %d => strip size: %d (%d..%d)\n", rank, WIDTH, HEIGHT, stripSize, stripStart, stripEnd);


        sendStripstoAllProcesses(rank);
        stripImageMat = Mat(stripSize, WIDTH, CV_8U, stripMatrix);
        stripImageMat.data = tempBuffer;
        //stripImageMat = stripImageMat(Rect(0, 0, WIDTH, stripSize));
        /*char winName[] = "window at rank ";
        winName[15] = rank + '0';
        winName[16] = '\0';
        imshow(winName, stripImageMat);*/
        //waitKey(0);


        //writeIntermediatoryImage();
        MPI_Barrier(MPI_COMM_WORLD);
        //TODO: Do whatever you wnant to. The intermediatory images are generated in "/res/it". Apply any filter or operation you want.
        GaussianBlur(stripImageMat, stripImageMat, Size(7, 7), 1.5, 1.5);
        Canny(stripImageMat, stripImageMat, 0, 30, 3);
        stichImages();
        if (rank == 0) {
            //writeStichedImage("../res/final.pgm");
            Mat fullImageMat = Mat(HEIGHT, WIDTH, CV_8U, fullImage);
            //stripImageMat.data = fullImage;
            //stripImageMat = stripImageMat(Rect(0, 0, WIDTH, stripSize));
            char finalWinName[] = "Final window ";
            imshow(finalWinName, fullImageMat);
        }
        if (waitKey(1) == 27) break;
    }
    cleanUp();
    MPI_Finalize();

    return 0;
}